

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::GLES2ThreadedSharingTest::addShaderOperations(GLES2ThreadedSharingTest *this,GLenum type)

{
  value_type pEVar1;
  reference ppEVar2;
  CreateShader *this_00;
  ShaderSource *pSVar3;
  ShaderCompile *pSVar4;
  DeleteShader *pDVar5;
  char *local_120;
  char *local_108;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_d0;
  undefined1 local_b9;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_b8;
  undefined1 local_a1;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_a0;
  undefined1 local_89;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_88;
  undefined1 local_71;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_70;
  undefined1 local_59;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_58;
  char *local_48;
  char *fragmentShaderSource;
  char *vertexShaderSource;
  undefined1 local_28 [8];
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> shader;
  GLenum type_local;
  GLES2ThreadedSharingTest *this_local;
  
  shader.m_state._4_4_ = type;
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::SharedPtr
            ((SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *)local_28);
  ppEVar2 = std::
            vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
            ::operator[](&this->m_threads,0);
  pEVar1 = *ppEVar2;
  this_00 = (CreateShader *)operator_new(0x80);
  GLES2ThreadTest::CreateShader::CreateShader
            (this_00,shader.m_state._4_4_,(SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *)local_28,
             (bool)((this->m_config).useFenceSync & 1),(bool)((this->m_config).serverSync & 1));
  tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)this_00);
  if ((this->m_config).define != 0) {
    fragmentShaderSource =
         "attribute mediump vec4 a_pos;\nvoid main(void)\n{\n\tgl_Position = a_pos;\n}";
    local_48 = "void main(void)\n{\n\tgl_FragColor = vec4(1.0, 0.0, 0.0, 1.0);\n}";
    if (((this->m_config).modify == 0) && (((this->m_config).render & 1U) == 0)) {
      ppEVar2 = std::
                vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                ::operator[](&this->m_threads,1);
      pEVar1 = *ppEVar2;
      pSVar3 = (ShaderSource *)operator_new(0x98);
      local_71 = 1;
      de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::SharedPtr
                (&local_70,(SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *)local_28);
      if (shader.m_state._4_4_ == 0x8b31) {
        local_120 = fragmentShaderSource;
      }
      else {
        local_120 = local_48;
      }
      GLES2ThreadTest::ShaderSource::ShaderSource
                (pSVar3,&local_70,local_120,(bool)((this->m_config).useFenceSync & 1),
                 (bool)((this->m_config).serverSync & 1));
      local_71 = 0;
      tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pSVar3);
      de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::~SharedPtr(&local_70);
    }
    else {
      ppEVar2 = std::
                vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                ::operator[](&this->m_threads,0);
      pEVar1 = *ppEVar2;
      pSVar3 = (ShaderSource *)operator_new(0x98);
      local_59 = 1;
      de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::SharedPtr
                (&local_58,(SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *)local_28);
      if (shader.m_state._4_4_ == 0x8b31) {
        local_108 = fragmentShaderSource;
      }
      else {
        local_108 = local_48;
      }
      GLES2ThreadTest::ShaderSource::ShaderSource
                (pSVar3,&local_58,local_108,(bool)((this->m_config).useFenceSync & 1),
                 (bool)((this->m_config).serverSync & 1));
      local_59 = 0;
      tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pSVar3);
      de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::~SharedPtr(&local_58);
    }
  }
  if ((this->m_config).modify != 0) {
    if (((this->m_config).render & 1U) == 0) {
      ppEVar2 = std::
                vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                ::operator[](&this->m_threads,1);
      pEVar1 = *ppEVar2;
      pSVar4 = (ShaderCompile *)operator_new(0x78);
      local_a1 = 1;
      de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::SharedPtr
                (&local_a0,(SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *)local_28);
      GLES2ThreadTest::ShaderCompile::ShaderCompile
                (pSVar4,&local_a0,(bool)((this->m_config).useFenceSync & 1),
                 (bool)((this->m_config).serverSync & 1));
      local_a1 = 0;
      tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pSVar4);
      de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::~SharedPtr(&local_a0);
    }
    else {
      ppEVar2 = std::
                vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                ::operator[](&this->m_threads,0);
      pEVar1 = *ppEVar2;
      pSVar4 = (ShaderCompile *)operator_new(0x78);
      local_89 = 1;
      de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::SharedPtr
                (&local_88,(SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *)local_28);
      GLES2ThreadTest::ShaderCompile::ShaderCompile
                (pSVar4,&local_88,(bool)((this->m_config).useFenceSync & 1),
                 (bool)((this->m_config).serverSync & 1));
      local_89 = 0;
      tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pSVar4);
      de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::~SharedPtr(&local_88);
    }
  }
  if (((this->m_config).modify == 0) && (((this->m_config).render & 1U) == 0)) {
    ppEVar2 = std::
              vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ::operator[](&this->m_threads,1);
    pEVar1 = *ppEVar2;
    pDVar5 = (DeleteShader *)operator_new(0x78);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::SharedPtr
              (&local_d0,(SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *)local_28);
    GLES2ThreadTest::DeleteShader::DeleteShader
              (pDVar5,&local_d0,(bool)((this->m_config).useFenceSync & 1),
               (bool)((this->m_config).serverSync & 1));
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pDVar5);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::~SharedPtr(&local_d0);
  }
  else {
    ppEVar2 = std::
              vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ::operator[](&this->m_threads,0);
    pEVar1 = *ppEVar2;
    pDVar5 = (DeleteShader *)operator_new(0x78);
    local_b9 = 1;
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::SharedPtr
              (&local_b8,(SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *)local_28);
    GLES2ThreadTest::DeleteShader::DeleteShader
              (pDVar5,&local_b8,(bool)((this->m_config).useFenceSync & 1),
               (bool)((this->m_config).serverSync & 1));
    local_b9 = 0;
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pDVar5);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::~SharedPtr(&local_b8);
  }
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::~SharedPtr
            ((SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *)local_28);
  return;
}

Assistant:

void GLES2ThreadedSharingTest::addShaderOperations (GLenum type)
{
	SharedPtr<GLES2ThreadTest::Shader> shader;

	m_threads[0]->addOperation(new GLES2ThreadTest::CreateShader(type, shader, m_config.useFenceSync, m_config.serverSync));

	if (m_config.define)
	{
		const char* vertexShaderSource =
		"attribute mediump vec4 a_pos;\n"
		"void main(void)\n"
		"{\n"
		"\tgl_Position = a_pos;\n"
		"}";

		const char* fragmentShaderSource =
		"void main(void)\n"
		"{\n"
		"\tgl_FragColor = vec4(1.0, 0.0, 0.0, 1.0);\n"
		"}";

		if (m_config.modify || m_config.render)
			m_threads[0]->addOperation(new GLES2ThreadTest::ShaderSource(shader, (type == GL_VERTEX_SHADER ? vertexShaderSource : fragmentShaderSource), m_config.useFenceSync, m_config.serverSync));
		else
			m_threads[1]->addOperation(new GLES2ThreadTest::ShaderSource(shader, (type == GL_VERTEX_SHADER ? vertexShaderSource : fragmentShaderSource), m_config.useFenceSync, m_config.serverSync));
	}

	if (m_config.modify)
	{
		if (m_config.render)
			m_threads[0]->addOperation(new GLES2ThreadTest::ShaderCompile(shader, m_config.useFenceSync, m_config.serverSync));
		else
			m_threads[1]->addOperation(new GLES2ThreadTest::ShaderCompile(shader, m_config.useFenceSync, m_config.serverSync));
	}

	DE_ASSERT(!m_config.render);

	if (m_config.modify || m_config.render)
		m_threads[0]->addOperation(new GLES2ThreadTest::DeleteShader(shader, m_config.useFenceSync, m_config.serverSync));
	else
		m_threads[1]->addOperation(new GLES2ThreadTest::DeleteShader(shader, m_config.useFenceSync, m_config.serverSync));
}